

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

char * nk_str_at_rune(nk_str *str,int pos,nk_rune *unicode,int *len)

{
  int clen;
  int iVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  
  if (str == (nk_str *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x219f,"char *nk_str_at_rune(struct nk_str *, int, nk_rune *, int *)");
  }
  if (unicode == (nk_rune *)0x0) {
    __assert_fail("unicode",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x21a0,"char *nk_str_at_rune(struct nk_str *, int, nk_rune *, int *)");
  }
  if (len == (int *)0x0) {
    __assert_fail("len",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x21a1,"char *nk_str_at_rune(struct nk_str *, int, nk_rune *, int *)");
  }
  if (pos < 0) {
    pcVar2 = (char *)0x0;
    *unicode = 0;
    *len = 0;
  }
  else {
    pcVar2 = (char *)(str->buffer).memory.ptr;
    clen = (int)(str->buffer).allocated;
    iVar1 = nk_utf_decode(pcVar2,unicode,clen);
    if (iVar1 == 0) {
      iVar3 = 0;
      iVar4 = 0;
    }
    else {
      iVar4 = 0;
      iVar3 = 0;
      do {
        if (pos == iVar4) {
          *len = iVar1;
          goto LAB_00108130;
        }
        iVar4 = iVar4 + 1;
        iVar3 = iVar3 + iVar1;
        iVar1 = nk_utf_decode(pcVar2 + iVar3,unicode,clen - iVar3);
      } while (iVar1 != 0);
    }
    if (iVar4 == pos) {
LAB_00108130:
      pcVar2 = pcVar2 + iVar3;
    }
    else {
      pcVar2 = (char *)0x0;
    }
  }
  return pcVar2;
}

Assistant:

NK_API char*
nk_str_at_rune(struct nk_str *str, int pos, nk_rune *unicode, int *len)
{
    int i = 0;
    int src_len = 0;
    int glyph_len = 0;
    char *text;
    int text_len;

    NK_ASSERT(str);
    NK_ASSERT(unicode);
    NK_ASSERT(len);

    if (!str || !unicode || !len) return 0;
    if (pos < 0) {
        *unicode = 0;
        *len = 0;
        return 0;
    }

    text = (char*)str->buffer.memory.ptr;
    text_len = (int)str->buffer.allocated;
    glyph_len = nk_utf_decode(text, unicode, text_len);
    while (glyph_len) {
        if (i == pos) {
            *len = glyph_len;
            break;
        }

        i++;
        src_len = src_len + glyph_len;
        glyph_len = nk_utf_decode(text + src_len, unicode, text_len - src_len);
    }
    if (i != pos) return 0;
    return text + src_len;
}